

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_name_tests.cpp
# Opt level: O0

void __thiscall
iu_iuRenameParamTest_x_iutest_x_Test_Test::Body(iu_iuRenameParamTest_x_iutest_x_Test_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  UnitTest *pUVar3;
  TestInfo *pTVar4;
  char *pcVar5;
  type **in_stack_fffffffffffffbd8;
  AssertionHelper local_3e8;
  Fixed local_3b8;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_iuRenameParamTest_x_iutest_x_Test_Test *this_local;
  
  iutest_ar._32_8_ = this;
  pPVar2 = iutest::WithParamInterface<bool>::GetParam();
  if ((*pPVar2 & 1U) == 0) {
    iutest::detail::AlwaysZero();
    pUVar3 = iutest::UnitTest::GetInstance();
    pTVar4 = iutest::UnitTest::current_test_info(pUVar3);
    pcVar5 = iutest::TestInfo::name(pTVar4);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_230,(internal *)"\"Test/false\"",
               "::iutest::UnitTest::GetInstance()->current_test_info()->name()","Test/false",pcVar5,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffbd8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      memset(&local_3b8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3b8);
      pcVar5 = iutest::AssertionResult::message((AssertionResult *)local_230);
      iutest::AssertionHelper::AssertionHelper
                (&local_3e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_name_tests.cpp"
                 ,0x2a,pcVar5,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_3e8,&local_3b8);
      iutest::AssertionHelper::~AssertionHelper(&local_3e8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3b8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  }
  else {
    iutest::detail::AlwaysZero();
    pUVar3 = iutest::UnitTest::GetInstance();
    pTVar4 = iutest::UnitTest::current_test_info(pUVar3);
    pcVar5 = iutest::TestInfo::name(pTVar4);
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              ((AssertionResult *)local_38,(internal *)"\"Test/true\"",
               "::iutest::UnitTest::GetInstance()->current_test_info()->name()","Test/true",pcVar5,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffbd8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
    if (!bVar1) {
      memset(&local_1d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
      pcVar5 = iutest::AssertionResult::message((AssertionResult *)local_38);
      iutest::AssertionHelper::AssertionHelper
                (&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_name_tests.cpp"
                 ,0x26,pcVar5,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_200,&local_1d0);
      iutest::AssertionHelper::~AssertionHelper(&local_200);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  }
  return;
}

Assistant:

IUTEST_P(iuRenameParamTest, Test)
{
    if( GetParam() )
    {
        IUTEST_ASSERT_STREQ("Test/true", ::iutest::UnitTest::GetInstance()->current_test_info()->name());
    }
    else
    {
        IUTEST_ASSERT_STREQ("Test/false", ::iutest::UnitTest::GetInstance()->current_test_info()->name());
    }
}